

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondaryOperationalData.h
# Opt level: O0

SecondaryOperationalData * __thiscall
KDIS::DATA_TYPE::SecondaryOperationalData::operator=
          (SecondaryOperationalData *this,SecondaryOperationalData *param_1)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  SecondaryOperationalData *param_1_local;
  SecondaryOperationalData *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KVar1 = param_1->m_ui8Param2;
  KVar2 = param_1->m_ui16NumFundParamSets;
  this->m_ui8Param1 = param_1->m_ui8Param1;
  this->m_ui8Param2 = KVar1;
  this->m_ui16NumFundParamSets = KVar2;
  return this;
}

Assistant:

class KDIS_EXPORT SecondaryOperationalData : public DataTypeBase
{
protected:

    KUINT8 m_ui8Param1;

    KUINT8 m_ui8Param2;

    KUINT16 m_ui16NumFundParamSets;

public:

    static const KUINT16 SECONDARY_OPERATIONAL_DATA_SIZE = 4;

    SecondaryOperationalData();

    SecondaryOperationalData(KDataStream &stream) noexcept(false);

    SecondaryOperationalData( KUINT8 Param1, KUINT8 Param2, KUINT16 NumFundParamSets );

    virtual ~SecondaryOperationalData();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SecondaryOperationalData::SetParameter1
    //              KDIS::DATA_TYPE::SecondaryOperationalData::GetParameter1
    // Description: Operational parameter 1. Represented as an enumeration, only
    //              0 is currently defined as Other.
    // Parameter:   const KUINT8 P, void
    //************************************
    void SetParameter1( KUINT8 P );
    KUINT8 GetParameter1() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SecondaryOperationalData::SetParameter2
    //              KDIS::DATA_TYPE::SecondaryOperationalData::GetParameter2
    // Description: Operational parameter 2. Represented as an enumeration, only
    //              0 is currently defined as Other.
    // Parameter:   const KUINT8 P, void
    //************************************
    void SetParameter2( KUINT8 P );
    KUINT8 GetParameter2() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SecondaryOperationalData::SetNumberOfFundamentalParamSets
    //              KDIS::DATA_TYPE::SecondaryOperationalData::GetNumberOfFundamentalParamSets
    // Description: Returns number of Fundamental Parameter Data Sets
    // Paramter:    KUINT8 NFPDS, void
    //************************************
    void SetNumberOfFundamentalParamSets( KUINT8 NFPDS );
    KUINT16 GetNumberOfFundamentalParamSets() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SecondaryOperationalData::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SecondaryOperationalData::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::SecondaryOperationalData::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const SecondaryOperationalData & Value ) const;
    KBOOL operator != ( const SecondaryOperationalData & Value ) const;
}